

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_hishelf2_init_preallocated
                    (ma_hishelf2_config *pConfig,void *pHeap,ma_hishelf2 *pFilter)

{
  double dVar1;
  double dVar2;
  double __x;
  ma_result mVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ma_biquad_config bqConfig;
  ma_biquad_config local_50;
  
  mVar3 = MA_INVALID_ARGS;
  if (pFilter != (ma_hishelf2 *)0x0) {
    (pFilter->bq)._pHeap = (void *)0x0;
    *(undefined8 *)&(pFilter->bq)._ownsHeap = 0;
    (pFilter->bq).pR1 = (ma_biquad_coefficient *)0x0;
    (pFilter->bq).pR2 = (ma_biquad_coefficient *)0x0;
    (pFilter->bq).b2 = (ma_biquad_coefficient)0x0;
    (pFilter->bq).a1 = (ma_biquad_coefficient)0x0;
    *(undefined8 *)&(pFilter->bq).a2 = 0;
    (pFilter->bq).format = ma_format_unknown;
    (pFilter->bq).channels = 0;
    (pFilter->bq).b0 = (ma_biquad_coefficient)0x0;
    (pFilter->bq).b1 = (ma_biquad_coefficient)0x0;
    if (pConfig != (ma_hishelf2_config *)0x0) {
      dVar1 = (pConfig->frequency * 6.283185307179586) / (double)pConfig->sampleRate;
      dVar2 = sin(dVar1);
      dVar1 = sin(1.5707963267948966 - dVar1);
      __x = pow(10.0,pConfig->gainDB / 40.0);
      dVar4 = (1.0 / pConfig->shelfSlope + -1.0) * (1.0 / __x + __x) + 2.0;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      if (__x < 0.0) {
        dVar5 = sqrt(__x);
      }
      else {
        dVar5 = SQRT(__x);
      }
      dVar6 = dVar2 * 0.5 * dVar4 * (dVar5 + dVar5);
      local_50.format = pConfig->format;
      local_50.channels = pConfig->channels;
      dVar4 = __x + -1.0;
      dVar5 = __x + 1.0;
      dVar2 = dVar4 * dVar1 + dVar5;
      local_50.b2 = (dVar2 - dVar6) * __x;
      local_50.a2 = dVar5 - dVar1 * dVar4;
      local_50.a1 = dVar4 - dVar1 * dVar5;
      local_50.a0 = local_50.a2 + dVar6;
      local_50.a1 = local_50.a1 + local_50.a1;
      local_50.a2 = local_50.a2 - dVar6;
      local_50.b0 = __x * (dVar2 + dVar6);
      local_50.b1 = (dVar5 * dVar1 + dVar4) * __x * -2.0;
      mVar3 = ma_biquad_init_preallocated(&local_50,pHeap,&pFilter->bq);
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_hishelf2_init_preallocated(const ma_hishelf2_config* pConfig, void* pHeap, ma_hishelf2* pFilter)
{
    ma_result result;
    ma_biquad_config bqConfig;

    if (pFilter == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pFilter);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    bqConfig = ma_hishelf2__get_biquad_config(pConfig);
    result = ma_biquad_init_preallocated(&bqConfig, pHeap, &pFilter->bq);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}